

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datefmt.cpp
# Opt level: O0

UDate __thiscall icu_63::DateFormat::parse(DateFormat *this,UnicodeString *text,ParsePosition *pos)

{
  UBool UVar1;
  int iVar2;
  int32_t iVar3;
  undefined4 extraout_var;
  UErrorCode local_38;
  int32_t local_34;
  UErrorCode ec;
  int32_t start;
  Calendar *calClone;
  UDate d;
  ParsePosition *pos_local;
  UnicodeString *text_local;
  DateFormat *this_local;
  
  calClone = (Calendar *)0x0;
  if (this->fCalendar != (Calendar *)0x0) {
    d = (UDate)pos;
    pos_local = (ParsePosition *)text;
    text_local = (UnicodeString *)this;
    iVar2 = (*(this->fCalendar->super_UObject)._vptr_UObject[3])();
    _ec = (Calendar *)CONCAT44(extraout_var,iVar2);
    if (_ec != (Calendar *)0x0) {
      local_34 = ParsePosition::getIndex((ParsePosition *)d);
      Calendar::clear(_ec);
      (*(this->super_Format).super_UObject._vptr_UObject[0xb])(this,pos_local,_ec,d);
      iVar3 = ParsePosition::getIndex((ParsePosition *)d);
      if (iVar3 != local_34) {
        local_38 = U_ZERO_ERROR;
        calClone = (Calendar *)Calendar::getTime(_ec,&local_38);
        UVar1 = ::U_FAILURE(local_38);
        if (UVar1 != '\0') {
          ParsePosition::setIndex((ParsePosition *)d,local_34);
          ParsePosition::setErrorIndex((ParsePosition *)d,local_34);
          calClone = (Calendar *)0x0;
        }
      }
      if (_ec != (Calendar *)0x0) {
        (*(_ec->super_UObject)._vptr_UObject[1])();
      }
    }
  }
  return (UDate)calClone;
}

Assistant:

UDate
DateFormat::parse(const UnicodeString& text,
                  ParsePosition& pos) const
{
    UDate d = 0; // Error return UDate is 0 (the epoch)
    if (fCalendar != NULL) {
        Calendar* calClone = fCalendar->clone();
        if (calClone != NULL) {
            int32_t start = pos.getIndex();
            calClone->clear();
            parse(text, *calClone, pos);
            if (pos.getIndex() != start) {
                UErrorCode ec = U_ZERO_ERROR;
                d = calClone->getTime(ec);
                if (U_FAILURE(ec)) {
                    // We arrive here if fCalendar => calClone is non-lenient and
                    // there is an out-of-range field.  We don't know which field
                    // was illegal so we set the error index to the start.
                    pos.setIndex(start);
                    pos.setErrorIndex(start);
                    d = 0;
                }
            }
            delete calClone;
        }
    }
    return d;
}